

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O2

bool __thiscall ON_FixedSizePool::InPool(ON_FixedSizePool *this,void *p)

{
  bool bVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  void **ppvVar4;
  undefined8 *puVar5;
  
  if (p == (void *)0x0) {
    return false;
  }
  puVar2 = (undefined8 *)this->m_first_block;
  do {
    bVar1 = puVar2 != (undefined8 *)0x0;
    if (puVar2 == (undefined8 *)0x0) {
      return bVar1;
    }
    if (puVar2 == (undefined8 *)this->m_al_block) {
      puVar5 = (undefined8 *)0x0;
      ppvVar4 = &this->m_al_element_array;
    }
    else {
      puVar5 = (undefined8 *)*puVar2;
      ppvVar4 = (void **)(puVar2 + 1);
    }
    puVar3 = puVar2 + 2;
    puVar2 = puVar5;
  } while ((p < puVar3) || (*ppvVar4 <= p));
  return bVar1;
}

Assistant:

bool ON_FixedSizePool::InPool(
  const void* p
) const
{
  if (nullptr != p)
  {
    const char* block;
    const char* block_end;
    const char* next_block;
    const char* ptr = (const char*)p;
    for (block = (const char*)m_first_block; 0 != block; block = next_block)
    {
      if (block == m_al_block)
      {
        // After a ReturnAll(), a multi-block fsp has unused blocks after m_al_block.
        // Searching must terminate at m_al_block.
        next_block = nullptr;
        block_end = (const char*)m_al_element_array;
        block += (2 * sizeof(void*));
      }
      else
      {
        next_block = *((const char**)block);
        block += sizeof(void*);
        block_end = *((const char**)(block));
        block += sizeof(void*);
      }
      if (ptr >= block && ptr < block_end)
        return true;
    }
  }

  return false;
}